

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void sbs_ensure_room(sbs_t *sbs,uint32_t v)

{
  uint uVar1;
  void *pvVar2;
  uint in_ESI;
  long in_RDI;
  uint32_t j;
  uint32_t new_size;
  uint32_t i;
  undefined4 local_18;
  
  if (*(uint *)(in_RDI + 0x10) <= in_ESI >> 6) {
    uVar1 = ((in_ESI >> 6) + 1) * 3 >> 1;
    pvVar2 = realloc(*(void **)(in_RDI + 8),(ulong)uVar1 << 3);
    *(void **)(in_RDI + 8) = pvVar2;
    for (local_18 = *(uint *)(in_RDI + 0x10); local_18 < uVar1; local_18 = local_18 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 8) + (ulong)local_18 * 8) = 0;
    }
    *(uint *)(in_RDI + 0x10) = uVar1;
  }
  return;
}

Assistant:

void sbs_ensure_room(sbs_t *sbs, uint32_t v) {
    uint32_t i = v / 64;
    if (i >= sbs->size) {
        uint32_t new_size = (i + 1) * 3 / 2;
        sbs->words =
            (uint64_t *)realloc(sbs->words, new_size * sizeof(uint64_t));
        for (uint32_t j = sbs->size; j < new_size; j++) {
            sbs->words[j] = 0;
        }
        sbs->size = new_size;
    }
}